

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O3

int __thiscall Fl_Tree::select_only(Fl_Tree *this,Fl_Tree_Item *selitem,int docallback)

{
  Fl_Tree_Item *item;
  fd_set *in_RCX;
  int iVar1;
  fd_set *in_R8;
  timeval *in_R9;
  
  item = this->_root;
  if (selitem == (Fl_Tree_Item *)0x0) {
    selitem = item;
    if (item == (Fl_Tree_Item *)0x0) {
      return 0;
    }
  }
  else if (item == (Fl_Tree_Item *)0x0) {
    iVar1 = 0;
    goto LAB_001d8d59;
  }
  iVar1 = 0;
  do {
    if ((item != selitem) && (item->_selected != '\0')) {
      deselect(this,item,docallback);
      iVar1 = iVar1 + 1;
    }
    item = Fl_Tree_Item::next(item);
  } while (item != (Fl_Tree_Item *)0x0);
LAB_001d8d59:
  if (selitem->_selected == '\0') {
    select(this,(int)selitem,(fd_set *)(ulong)(uint)docallback,in_RCX,in_R8,in_R9);
    iVar1 = iVar1 + 1;
  }
  return iVar1;
}

Assistant:

int Fl_Tree::select_only(Fl_Tree_Item *selitem, int docallback) {
  selitem = selitem ? selitem : first();	// NULL? use first()
  if ( ! selitem ) return(0);
  int changed = 0;
  // Deselect everything first.
  //    Prevents callbacks from seeing more than one item selected.
  //
  for ( Fl_Tree_Item *item = first(); item; item = item->next() ) {
    if ( item == selitem ) continue;		// don't do anything to selitem yet..
    if ( item->is_selected() ) {
      deselect(item, docallback);
      ++changed;
    }
  }
#if FLTK_ABI_VERSION >= 10301
  // Should we 'reselect' item if already selected?
  if ( selitem->is_selected() && (item_reselect_mode()==FL_TREE_SELECTABLE_ALWAYS) ) {
    // Selection unchanged, so no ++changed
    select(selitem, docallback);			// do callback with reason=reselect
  } else if ( !selitem->is_selected() ) {
    // Item was not already selected, select and indicate changed
    select(selitem, docallback);
    ++changed;
  }
#else
  if ( !selitem->is_selected() ) {
    // All items deselected, now select the one we want
    select(selitem, docallback);
    ++changed;
  }
#endif
  return(changed);
}